

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O3

void __thiscall
axl::sl::ArrayRef<axl::io::SockAddr,_axl::sl::ArrayDetails<axl::io::SockAddr>_>::release
          (ArrayRef<axl::io::SockAddr,_axl::sl::ArrayDetails<axl::io::SockAddr>_> *this)

{
  int32_t *piVar1;
  Hdr *pHVar2;
  FreeFunc *pFVar3;
  
  pHVar2 = this->m_hdr;
  if (pHVar2 != (Hdr *)0x0) {
    LOCK();
    piVar1 = &(pHVar2->super_BufHdr).super_RefCount.m_refCount;
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      (**(pHVar2->super_BufHdr).super_RefCount._vptr_RefCount)(pHVar2);
      LOCK();
      piVar1 = &(pHVar2->super_BufHdr).super_RefCount.m_weakRefCount;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if ((*piVar1 == 0) &&
         (pFVar3 = (pHVar2->super_BufHdr).super_RefCount.m_freeFunc, pFVar3 != (FreeFunc *)0x0)) {
        (*pFVar3)(pHVar2);
      }
    }
  }
  this->m_p = (SockAddr *)0x0;
  this->m_hdr = (Hdr *)0x0;
  this->m_count = 0;
  return;
}

Assistant:

void
	release() {
		if (m_hdr)
			m_hdr->release();

		initialize();
	}